

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VTKData.h
# Opt level: O2

void __thiscall VTKCollection::append(VTKCollection *this,string *filename)

{
  ostream *poVar1;
  
  if (this->hasHeader_ == false) {
    writeHeader(this);
  }
  poVar1 = std::operator<<((ostream *)this,"<DataSet group=\"\" part=\"0\" timestep=\"");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\" file=\"");
  poVar1 = std::operator<<(poVar1,(string *)filename);
  std::operator<<(poVar1,"\" />\n");
  this->recordID_ = this->recordID_ + 1;
  return;
}

Assistant:

void append(std::string filename)
  {
    if (!hasHeader_)
      writeHeader();
      
    outFile_ <<
      "<DataSet group=\"\" part=\"0\" timestep=\"" << recordID_ << "\" file=\"" << filename << "\" />\n";
    
    recordID_++;
  }